

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

Value * __thiscall
camp::Function::call(Value *__return_storage_ptr__,Function *this,UserObject *object,Args *args)

{
  element_type *peVar1;
  char cVar2;
  size_t sVar3;
  ForbiddenCall *__return_storage_ptr___00;
  NotEnoughArguments *__return_storage_ptr___01;
  string local_f8;
  string local_d8;
  NotEnoughArguments local_b8;
  ForbiddenCall local_70;
  
  peVar1 = (this->m_callable).m_getter.
           super___shared_ptr<camp::detail::GetterInterface<bool>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    cVar2 = (this->m_callable).m_defaultValue;
  }
  else {
    cVar2 = (**(code **)(*(long *)peVar1 + 0x10))(peVar1,object);
  }
  if (cVar2 != '\0') {
    sVar3 = Args::count(args);
    if (sVar3 < (ulong)((long)(this->m_argTypes).
                              super__Vector_base<camp::Type,_std::allocator<camp::Type>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(this->m_argTypes).
                              super__Vector_base<camp::Type,_std::allocator<camp::Type>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2)) {
      __return_storage_ptr___01 = (NotEnoughArguments *)__cxa_allocate_exception(0x48);
      sVar3 = Args::count(args);
      NotEnoughArguments::NotEnoughArguments
                (&local_b8,&this->m_name,sVar3,
                 (long)(this->m_argTypes).
                       super__Vector_base<camp::Type,_std::allocator<camp::Type>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_argTypes).
                       super__Vector_base<camp::Type,_std::allocator<camp::Type>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/function.cpp"
                 ,"");
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,
                 "Value camp::Function::call(const UserObject &, const Args &) const","");
      Error::prepare<camp::NotEnoughArguments>
                (__return_storage_ptr___01,&local_b8,&local_f8,0x56,&local_d8);
      __cxa_throw(__return_storage_ptr___01,&NotEnoughArguments::typeinfo,Error::~Error);
    }
    (*(this->super_TagHolder)._vptr_TagHolder[3])(__return_storage_ptr__,this,object,args);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (ForbiddenCall *)__cxa_allocate_exception(0x48);
  ForbiddenCall::ForbiddenCall(&local_70,&this->m_name);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/function.cpp"
             ,"");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,
             "Value camp::Function::call(const UserObject &, const Args &) const","");
  Error::prepare<camp::ForbiddenCall>(__return_storage_ptr___00,&local_70,&local_f8,0x52,&local_d8);
  __cxa_throw(__return_storage_ptr___00,&ForbiddenCall::typeinfo,Error::~Error);
}

Assistant:

Value Function::call(const UserObject& object, const Args& args) const
{
    // Check if the function is callable
    if (!callable(object))
        CAMP_ERROR(ForbiddenCall(name()));

    // Check the number of arguments
    if (args.count() < m_argTypes.size())
        CAMP_ERROR(NotEnoughArguments(name(), args.count(), m_argTypes.size()));

    // Execute the function
    return execute(object, args);
}